

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O2

void Abc_SopToTruthBig(char *pSop,int nInputs,word **pVars,word *pCube,word *pRes)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  
  uVar2 = Abc_SopGetVarNum(pSop);
  uVar8 = 1 << ((char)uVar2 - 6U & 0x1f);
  uVar7 = 0;
  if (0 < (int)uVar8) {
    uVar7 = (ulong)uVar8;
  }
  if (0x10 < uVar2) {
    __assert_fail("nVars >= 0 && nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcSop.c"
                  ,0x52a,"void Abc_SopToTruthBig(char *, int, word **, word *, word *)");
  }
  if (uVar2 != nInputs) {
    __assert_fail("nVars == nInputs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcSop.c"
                  ,0x52b,"void Abc_SopToTruthBig(char *, int, word **, word *, word *)");
  }
  if ((int)uVar2 < 7) {
    uVar7 = 1;
  }
  for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
    pRes[uVar4] = 0;
  }
  lVar5 = 0;
  while( true ) {
    for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
      pCube[uVar4] = 0xffffffffffffffff;
    }
    lVar6 = (long)(int)lVar5;
    for (uVar4 = 0; uVar4 != (uint)nInputs; uVar4 = uVar4 + 1) {
      cVar1 = pSop[lVar6];
      if (cVar1 != '-') {
        if (cVar1 == '1') {
          for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
            pCube[uVar9] = pCube[uVar9] & pVars[uVar4][uVar9];
          }
        }
        else {
          if (cVar1 != '0') {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcSop.c"
                          ,0x53e,"void Abc_SopToTruthBig(char *, int, word **, word *, word *)");
          }
          for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
            pCube[uVar9] = pCube[uVar9] & ~pVars[uVar4][uVar9];
          }
        }
      }
      lVar6 = lVar6 + 1;
    }
    for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
      pRes[uVar4] = pRes[uVar4] | pCube[uVar4];
    }
    lVar6 = (long)((int)lVar5 + nInputs);
    if (pSop[lVar6] != ' ') break;
    if (pSop[lVar6 + 2] != '\n') {
      __assert_fail("pSop[lit] == \'\\n\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcSop.c"
                    ,0x545,"void Abc_SopToTruthBig(char *, int, word **, word *, word *)");
    }
    lVar5 = lVar6 + 3;
    if (pSop[lVar6 + 3] == '\0') {
      iVar3 = Abc_SopIsComplement(pSop);
      if (iVar3 != 0) {
        for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
          pRes[uVar4] = ~pRes[uVar4];
        }
      }
      return;
    }
  }
  __assert_fail("pSop[lit] == \' \'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcSop.c"
                ,0x542,"void Abc_SopToTruthBig(char *, int, word **, word *, word *)");
}

Assistant:

void Abc_SopToTruthBig( char * pSop, int nInputs, word ** pVars, word * pCube, word * pRes )
{
    int nVars = Abc_SopGetVarNum(pSop);
    int nWords = nVars <= 6 ? 1 : 1 << (nVars-6);
    int v, i, lit = 0;
    assert( nVars >= 0 && nVars <= 16 );
    assert( nVars == nInputs );
    for ( i = 0; i < nWords; i++ )
        pRes[i] = 0;
    do {
        for ( i = 0; i < nWords; i++ )
            pCube[i] = ~(word)0;
        for ( v = 0; v < nVars; v++, lit++ )
        {
            if ( pSop[lit] == '1' )
            {
                for ( i = 0; i < nWords; i++ )
                    pCube[i] &= pVars[v][i];
            }
            else if ( pSop[lit] == '0' )
            {
                for ( i = 0; i < nWords; i++ )
                    pCube[i] &= ~pVars[v][i];
            }
            else if ( pSop[lit] != '-' )
                assert( 0 );
        }
        for ( i = 0; i < nWords; i++ )
            pRes[i] |= pCube[i];
        assert( pSop[lit] == ' ' );
        lit++;
        lit++;
        assert( pSop[lit] == '\n' );
        lit++;
    } while ( pSop[lit] );
    if ( Abc_SopIsComplement(pSop) )
    {
        for ( i = 0; i < nWords; i++ )
            pRes[i] = ~pRes[i];
    }
}